

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

void __thiscall QSqlTableModel::revertAll(QSqlTableModel *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QList<int> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = 0xaaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.d.ptr = (int *)0xaaaaaaaaaaaaaaaa;
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::keys
            (&local_38,
             (QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
             (*(long *)&(this->super_QSqlQueryModel).field_0x8 + 0x2e0));
  if (-1 < (int)((int)local_38.d.size - 1U)) {
    uVar3 = (ulong)((int)local_38.d.size - 1U);
    do {
      iVar2 = 0;
      if (uVar3 < (ulong)local_38.d.size) {
        iVar2 = local_38.d.ptr[uVar3];
      }
      (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1c0))(this,iVar2);
      bVar1 = 0 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar1);
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlTableModel::revertAll()
{
    Q_D(QSqlTableModel);

    const QList<int> rows(d->cache.keys());
    for (int i = rows.size() - 1; i >= 0; --i)
        revertRow(rows.value(i));
}